

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::Options
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this,RegexFlags *flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  code *pcVar4;
  uint uVar5;
  bool bVar6;
  RegexFlags RVar7;
  undefined4 *puVar8;
  byte *pbVar9;
  uint uVar10;
  ThreadConfiguration *pTVar11;
  CharCount i;
  ulong uVar12;
  long lVar13;
  long lVar14;
  byte *pbVar15;
  
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pbVar15 = this->next;
  do {
    if (this->inputLim < pbVar15) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar6) goto LAB_00edd46d;
      *puVar8 = 0;
      pbVar15 = this->next;
    }
    bVar1 = *pbVar15;
    uVar12 = (ulong)bVar1;
    if (bVar1 == 0x5c) {
      if (this->inputLim < pbVar15 + 6) goto LAB_00edd037;
      if (this->inputLim < pbVar15 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar6) goto LAB_00edd46d;
        *puVar8 = 0;
        pbVar15 = this->next;
      }
      if (pbVar15[1] != 0x75) goto LAB_00edd037;
      if (this->inputLim < pbVar15 + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar6) goto LAB_00edd46d;
        *puVar8 = 0;
        pbVar15 = this->next;
      }
      if ((ASCIIChars::classes[pbVar15[2]] & 0x40) == 0) goto LAB_00edd037;
      if (this->inputLim < pbVar15 + 3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar6) goto LAB_00edd46d;
        *puVar8 = 0;
        pbVar15 = this->next;
      }
      if ((ASCIIChars::classes[pbVar15[3]] & 0x40) == 0) goto LAB_00edd037;
      if (this->inputLim < pbVar15 + 4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar6) goto LAB_00edd46d;
        *puVar8 = 0;
        pbVar15 = this->next;
      }
      if ((ASCIIChars::classes[pbVar15[4]] & 0x40) == 0) goto LAB_00edd037;
      if (this->inputLim < pbVar15 + 5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar6) goto LAB_00edd46d;
        *puVar8 = 0;
        pbVar15 = this->next;
      }
      if ((ASCIIChars::classes[pbVar15[5]] & 0x40) == 0) goto LAB_00edd037;
      if (((this->scriptContext->config).threadConfig)->m_ES6Unicode != false) goto LAB_00edd452;
      pbVar9 = this->inputLim;
      if (pbVar9 < pbVar15 + 2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar6) {
LAB_00edd46d:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar8 = 0;
        pbVar9 = this->inputLim;
        pbVar15 = this->next;
      }
      bVar1 = ASCIIChars::values[pbVar15[2]];
      if (pbVar9 < pbVar15 + 3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar6) goto LAB_00edd46d;
        *puVar8 = 0;
        pbVar9 = this->inputLim;
        pbVar15 = this->next;
      }
      bVar2 = ASCIIChars::values[pbVar15[3]];
      if (pbVar9 < pbVar15 + 4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar6) goto LAB_00edd46d;
        *puVar8 = 0;
        pbVar9 = this->inputLim;
        pbVar15 = this->next;
      }
      bVar3 = ASCIIChars::values[pbVar15[4]];
      if (pbVar9 < pbVar15 + 5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar6) goto LAB_00edd46d;
        *puVar8 = 0;
        pbVar15 = this->next;
      }
      uVar12 = (ulong)((uint)bVar3 << 4 | (uint)bVar2 << 8 | (uint)bVar1 << 0xc |
                      (uint)(byte)ASCIIChars::values[pbVar15[5]]);
      lVar14 = 6;
      if (0xf < bVar1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0x89,"(u <= MaxUChar)","u <= MaxUChar");
        if (!bVar6) goto LAB_00edd46d;
        *puVar8 = 0;
      }
    }
    else {
      if (bVar1 == 0) {
        return;
      }
LAB_00edd037:
      lVar14 = 1;
    }
    uVar5 = (uint)(uVar12 & 0xffff);
    uVar10 = uVar5 - 0x67;
    switch(uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f) {
    case 0:
      RVar7 = *flags;
      if ((RVar7 & GlobalRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar7 = *flags;
      }
      RVar7 = RVar7 | GlobalRegexFlag;
      break;
    case 1:
      RVar7 = *flags;
      if ((RVar7 & IgnoreCaseRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar7 = *flags;
      }
      RVar7 = RVar7 | IgnoreCaseRegexFlag;
      break;
    default:
switchD_00edd05d_caseD_2:
      if ((0xff < uVar5) || ((ASCIIChars::classes[uVar12 & 0xffff] & 1) == 0)) {
        return;
      }
LAB_00edd452:
      Fail(this,-0x7ff5ec67);
      return;
    case 3:
      RVar7 = *flags;
      if ((RVar7 & MultilineRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar7 = *flags;
      }
      RVar7 = RVar7 | MultilineRegexFlag;
      break;
    case 6:
      pTVar11 = (this->scriptContext->config).threadConfig;
      if (pTVar11->m_ES2018RegExDotAll != true) goto LAB_00edd115;
      RVar7 = *flags;
      if ((RVar7 & DotAllRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar7 = *flags;
      }
      RVar7 = RVar7 | DotAllRegexFlag;
      break;
    case 7:
      pTVar11 = (this->scriptContext->config).threadConfig;
LAB_00edd115:
      if (pTVar11->m_ES6Unicode != true) goto LAB_00edd13c;
      RVar7 = *flags;
      if ((RVar7 & UnicodeRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar7 = *flags;
      }
      RVar7 = RVar7 | UnicodeRegexFlag;
      break;
    case 9:
      pTVar11 = (this->scriptContext->config).threadConfig;
LAB_00edd13c:
      if (pTVar11->m_ES6RegExSticky != true) goto switchD_00edd05d_caseD_2;
      RVar7 = *flags;
      if ((RVar7 & StickyRegexFlag) != NoRegexFlags) {
        Fail(this,-0x7ff5ec67);
        RVar7 = *flags;
      }
      RVar7 = RVar7 | StickyRegexFlag;
    }
    *flags = RVar7;
    if (this->inputLim < this->next + lVar14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar6) goto LAB_00edd46d;
      *puVar8 = 0;
    }
    lVar13 = 0;
    do {
      if ((char)this->next[lVar13] < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar6) goto LAB_00edd46d;
        *puVar8 = 0;
      }
      lVar13 = lVar13 + 1;
    } while (lVar14 != lVar13);
    pbVar15 = this->next + lVar14;
    this->next = pbVar15;
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::Options(RegexFlags& flags)
    {
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            CharCount consume;
            Char c;

            if (ec == 0)
                // Embedded 0 not valid
                return;
            else if (IsLiteral &&
                ec == '\\' &&
                ECCanConsume(6) &&
                ECLookahead(1) == 'u' &&
                standardEncodedChars->IsHex(ECLookahead(2)) &&
                standardEncodedChars->IsHex(ECLookahead(3)) &&
                standardEncodedChars->IsHex(ECLookahead(4)) &&
                standardEncodedChars->IsHex(ECLookahead(5)))
            {
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    Fail(JSERR_RegExpSyntax);
                    return;
                }
                else
                {
                    uint32 n = (standardEncodedChars->DigitValue(ECLookahead(2)) << 12) |
                               (standardEncodedChars->DigitValue(ECLookahead(3)) << 8) |
                               (standardEncodedChars->DigitValue(ECLookahead(4)) << 4) |
                               (standardEncodedChars->DigitValue(ECLookahead(5)));
                    c = UTC(n);
                    consume = 6;
                }
            }
            else
            {
                c = Chars<EncodedChar>::CTW(ec);
                consume = 1;
            }

            switch (c) {
            case 'i':
                if ((flags & IgnoreCaseRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | IgnoreCaseRegexFlag);
                break;
            case 'g':
                if ((flags & GlobalRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | GlobalRegexFlag);
                break;
            case 'm':
                if ((flags & MultilineRegexFlag) != 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }
                flags = (RegexFlags)(flags | MultilineRegexFlag);
                break;
            case 's':
                if (scriptContext->GetConfig()->IsES2018RegExDotAllEnabled())
                {
                    if ((flags & DotAllRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | DotAllRegexFlag);
                    break;
                }
            case 'u':
                // If we don't have unicode enabled, fall through to default
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    if ((flags & UnicodeRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | UnicodeRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, UnicodeRegexFlag, scriptContext);

                    break;
                }
            case 'y':
                if (scriptContext->GetConfig()->IsES6RegExStickyEnabled())
                {
                    if ((flags & StickyRegexFlag) != 0)
                    {
                        Fail(JSERR_RegExpSyntax);
                    }
                    flags = (RegexFlags)(flags | StickyRegexFlag);
                    // For telemetry
                    CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, StickyRegexFlag, scriptContext);

                    break;
                }
            default:
                if (standardChars->IsWord(c))
                {
                    // Outer context could never parse this character. Signal the syntax error as
                    // being part of the regex.
                    Fail(JSERR_RegExpSyntax);
                }
                return;
            }

            ECConsume(consume);
        }
    }